

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

char * fits_find_match_delim(char *string,char delim)

{
  int iVar1;
  char in_SIL;
  char *in_RDI;
  int retval;
  char *tstr;
  char *local_20 [3];
  char *local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_20[0] = in_RDI;
    if (in_SIL == '\"') {
      iVar1 = find_doublequote(local_20);
    }
    else if (in_SIL == '\'') {
      iVar1 = find_quote(local_20);
    }
    else if (in_SIL == ')') {
      iVar1 = find_paren((char **)0x29);
    }
    else if (in_SIL == ']') {
      iVar1 = find_bracket((char **)0x5d);
    }
    else {
      if (in_SIL != '}') {
        return (char *)0x0;
      }
      iVar1 = find_curlybracket((char **)0x7d);
    }
    if (iVar1 == 0) {
      local_8 = local_20[0];
    }
    else {
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

char *fits_find_match_delim(char *string, char delim)
/*
  Find matching delimiter, respecting quoting and (potentially nested) parentheses
  
  char *string - null-terminated string to be searched for delimiter
  char delim - single delimiter to search for (one of '")]} )

  returns: pointer to character after delimiter, or 0 if not found
*/
{
  char *tstr = string;
  int retval = 0;

  if (!string) return 0;
  switch (delim) {
  case '\'': retval = find_quote(&tstr); break;
  case '"':  retval = find_doublequote(&tstr); break;
  case '}':  retval = find_curlybracket(&tstr); break;
  case ']':  retval = find_bracket(&tstr); break;
  case ')':  retval = find_paren(&tstr); break;
  default: return 0; /* Invalid delimeter, return failure */
  }

  /* Delimeter not found, return failure */
  if (retval) return 0;

  /* Delimeter was found, return next position */
  return (tstr);
}